

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::deriv
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,size_t Nderiv)

{
  ulong uVar1;
  double dVar2;
  Index IVar3;
  Index size;
  double *pdVar4;
  double *pdVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  vectype c;
  vectype cd;
  DenseStorage<double,__1,__1,_1,_0> local_58;
  vectype local_48;
  ChebyshevExpansion *local_38;
  
  local_38 = __return_storage_ptr__;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_58,(DenseStorage<double,__1,__1,_1,_0> *)this);
  if (Nderiv != 0) {
    sVar10 = 0;
    do {
      IVar3 = local_58.m_rows;
      local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      if (local_58.m_rows < 1) {
        __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0x130,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      uVar9 = local_58.m_rows - 1;
      pdVar4 = local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      if (uVar9 != 0) {
        free((void *)0x0);
        if (IVar3 == 1) {
          local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)0x0;
          pdVar4 = local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                   .m_data;
        }
        else {
          if (0x1fffffffffffffff < uVar9) {
LAB_0010a5b5:
            puVar6 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar6 = operator_new;
            __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pdVar4 = (double *)malloc(uVar9 * 8);
          if (uVar9 != 1 && ((ulong)pdVar4 & 0xf) != 0) goto LAB_0010a602;
          if (pdVar4 == (double *)0x0) goto LAB_0010a5b5;
        }
      }
      local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar4;
      pdVar4 = local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      uVar7 = 0;
      if (0 < (long)uVar9) {
        uVar7 = uVar9;
      }
      uVar8 = 0;
      do {
        local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             uVar9;
        if (uVar8 == uVar7) {
LAB_0010a577:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar8] = 0.0;
        uVar1 = uVar8 + 1;
        uVar12 = uVar1;
        if (uVar8 < uVar9) {
          do {
            if (((int)uVar12 - (int)uVar8 & 1U) != 0) {
              if (((long)uVar12 < 0) || (local_58.m_rows <= (long)uVar12)) goto LAB_0010a577;
              lVar11 = uVar12 * 2;
              auVar13._8_4_ = (int)((ulong)lVar11 >> 0x20);
              auVar13._0_8_ = lVar11;
              auVar13._12_4_ = 0x45300000;
              local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[uVar8] =
                   ((auVar13._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) *
                   local_58.m_data[uVar12] +
                   local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                   .m_data[uVar8];
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 <= uVar9);
        }
        if (uVar8 == 0) {
          if (IVar3 == 1) goto LAB_0010a577;
          *local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = *local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data * 0.5;
        }
        local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar8] = local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data[uVar8] / ((this->m_xmax - this->m_xmin) * 0.5);
        uVar8 = uVar1;
      } while (uVar1 != uVar9);
      if (Nderiv == 1) {
        ChebyshevExpansion(local_38,&local_48,this->m_xmin,this->m_xmax);
      }
      else {
        pdVar5 = local_58.m_data;
        uVar7 = local_58.m_rows;
        if (local_58.m_rows != uVar9) {
          free(local_58.m_data);
          uVar7 = uVar9;
          if (IVar3 == 1) {
            pdVar5 = (double *)0x0;
          }
          else {
            if (0x1fffffffffffffff < uVar9) {
LAB_0010a621:
              puVar6 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar6 = operator_new;
              __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            pdVar5 = (double *)malloc(uVar9 * 8);
            if (uVar9 != 1 && ((ulong)pdVar5 & 0xf) != 0) {
LAB_0010a602:
              __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                            ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
            }
            if (pdVar5 == (double *)0x0) goto LAB_0010a621;
          }
        }
        local_58.m_rows = uVar7;
        local_58.m_data = pdVar5;
        if (local_58.m_rows != uVar9) {
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                        ,0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                       );
        }
        uVar9 = local_58.m_rows - (local_58.m_rows >> 0x3f) & 0xfffffffffffffffe;
        if (1 < local_58.m_rows) {
          lVar11 = 0;
          do {
            pdVar5 = pdVar4 + lVar11;
            dVar2 = pdVar5[1];
            local_58.m_data[lVar11] = *pdVar5;
            (local_58.m_data + lVar11)[1] = dVar2;
            lVar11 = lVar11 + 2;
          } while (lVar11 < (long)uVar9);
        }
        if ((long)uVar9 < local_58.m_rows) {
          do {
            local_58.m_data[uVar9] = pdVar4[uVar9];
            uVar9 = uVar9 + 1;
          } while (local_58.m_rows != uVar9);
        }
      }
      free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      if (Nderiv == 1) goto LAB_0010a55a;
      sVar10 = sVar10 + 1;
    } while (sVar10 != Nderiv);
  }
  ChebyshevExpansion(local_38,(vectype *)&local_58,this->m_xmin,this->m_xmax);
LAB_0010a55a:
  free(local_58.m_data);
  return local_38;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::deriv(std::size_t Nderiv) const {
        // See Mason and Handscomb, p. 34, Eq. 2.52
        // and example in https ://github.com/numpy/numpy/blob/master/numpy/polynomial/chebyshev.py#L868-L964
        vectype c = m_c;
        for (std::size_t deriv_counter = 0; deriv_counter < Nderiv; ++deriv_counter) {
            std::size_t N = c.size() - 1, ///< Order of the expansion
                        Nd = N - 1; ///< Order of the derivative expansion
            vectype cd(N);
            for (std::size_t r = 0; r <= Nd; ++r) {
                cd(r) = 0;
                for (std::size_t k = r + 1; k <= N; ++k) {
                    // Terms where k-r is odd have values, otherwise, they are zero
                    if ((k - r) % 2 == 1) {
                        cd(r) += 2*k*c(k);
                    }
                }
                // The first term with r = 0 is divided by 2 (the single prime in Mason and Handscomb, p. 34, Eq. 2.52)
                if (r == 0) {
                    cd(r) /= 2;
                }
                // Rescale the values if the range is not [-1,1].  Arrives from the derivative of d(xreal)/d(x_{-1,1})
                cd(r) /= (m_xmax-m_xmin)/2.0;
            }
            if (Nderiv == 1) {
                return ChebyshevExpansion(std::move(cd), m_xmin, m_xmax);
            }
            else{
                c = cd;
            }
        }
        return ChebyshevExpansion(std::move(c), m_xmin, m_xmax);
    }